

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::process_list_fields(BinTextReader *this,FieldList *list)

{
  bool bVar1;
  char *msg;
  char *pos;
  
  TextReader::next_newline(&this->reader);
  while( true ) {
    pos = (this->reader).cur_;
    if (pos == (this->reader).cap_) {
      return true;
    }
    bVar1 = read_field(this,list);
    if (!bVar1) break;
    pos = (this->reader).cur_;
    bVar1 = TextReader::read_nested_separator_or_eof(&this->reader);
    if (!bVar1) {
      msg = "reader.read_nested_separator_or_eof()";
LAB_00128de5:
      bVar1 = fail_msg(this,msg,pos);
      return bVar1;
    }
  }
  msg = "read_field(list)";
  goto LAB_00128de5;
}

Assistant:

bool process_list_fields(FieldList& list) noexcept {
            reader.next_newline();
            while (!reader.is_eof()) {
                bin_assert(read_field(list));
                bin_assert(reader.read_nested_separator_or_eof());
            }
            return true;
        }